

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,___,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
                *message,uint tag,
               FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_H_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>_>
               *visitor)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_01;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_02;
  type_by_index_t<4UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_03;
  type_by_index_t<5UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_04;
  type_by_index_t<6UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_05;
  type_by_index_t<7UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_06;
  type_by_index_t<8UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_07;
  type_by_index_t<9UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_08;
  type_by_index_t<10UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_09;
  type_by_index_t<11UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_10;
  type_by_index_t<12UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_11;
  type_by_index_t<13UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_12;
  type_by_index_t<14UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_13;
  type_by_index_t<15UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_14;
  type_by_index_t<16UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_15;
  type_by_index_t<17UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_16;
  type_by_index_t<18UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_17;
  type_by_index_t<19UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_18;
  type_by_index_t<20UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_19;
  type_by_index_t<21UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_20;
  type_by_index_t<22UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_21;
  type_by_index_t<23UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_22;
  type_by_index_t<24UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *field_23;
  int dummy [26];
  int index;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_H_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>_>
  *visitor_local;
  uint tag_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_H_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>_>
  *message_local;
  
  dummy[0x19] = -1;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field,visitor,dummy + 0x19);
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_00,visitor,dummy + 0x19);
  dummy[0] = 0;
  field_01 = meta::
             get<2ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_01,visitor,dummy + 0x19);
  dummy[1] = 0;
  field_02 = meta::
             get<3ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_02,visitor,dummy + 0x19);
  dummy[2] = 0;
  field_03 = meta::
             get<4ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_03,visitor,dummy + 0x19);
  dummy[3] = 0;
  field_04 = meta::
             get<5ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<5ul,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_04,visitor,dummy + 0x19);
  dummy[4] = 0;
  field_05 = meta::
             get<6ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<6ul,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_05,visitor,dummy + 0x19);
  dummy[5] = 0;
  field_06 = meta::
             get<7ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<7ul,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_06,visitor,dummy + 0x19);
  dummy[6] = 0;
  field_07 = meta::
             get<8ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<8ul,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_07,visitor,dummy + 0x19);
  dummy[7] = 0;
  field_08 = meta::
             get<9ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<9ul,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_08,visitor,dummy + 0x19);
  dummy[8] = 0;
  field_09 = meta::
             get<10ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<10ul,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_09,visitor,dummy + 0x19);
  dummy[9] = 0;
  field_10 = meta::
             get<11ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<11ul,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_10,visitor,dummy + 0x19);
  dummy[10] = 0;
  field_11 = meta::
             get<12ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<12ul,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_11,visitor,dummy + 0x19);
  dummy[0xb] = 0;
  field_12 = meta::
             get<13ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<13ul,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_12,visitor,dummy + 0x19);
  dummy[0xc] = 0;
  field_13 = meta::
             get<14ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<14ul,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_13,visitor,dummy + 0x19);
  dummy[0xd] = 0;
  field_14 = meta::
             get<15ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<15ul,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_14,visitor,dummy + 0x19);
  dummy[0xe] = 0;
  field_15 = meta::
             get<16ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<16ul,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_15,visitor,dummy + 0x19);
  dummy[0xf] = 0;
  field_16 = meta::
             get<17ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<17ul,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_16,visitor,dummy + 0x19);
  dummy[0x10] = 0;
  field_17 = meta::
             get<18ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<18ul,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_17,visitor,dummy + 0x19);
  dummy[0x11] = 0;
  field_18 = meta::
             get<19ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<19ul,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_18,visitor,dummy + 0x19);
  dummy[0x12] = 0;
  field_19 = meta::
             get<20ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<20ul,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_19,visitor,dummy + 0x19);
  dummy[0x13] = 0;
  field_20 = meta::
             get<21ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<21ul,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_20,visitor,dummy + 0x19);
  dummy[0x14] = 0;
  field_21 = meta::
             get<22ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<22ul,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_21,visitor,dummy + 0x19);
  dummy[0x15] = 0;
  field_22 = meta::
             get<23ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<23ul,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_22,visitor,dummy + 0x19);
  dummy[0x16] = 0;
  field_23 = meta::
             get<24ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>>
                       (message);
  doVisitSingleField<24ul,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)72>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>>>>
            (tag,field_23,visitor,dummy + 0x19);
  dummy[0x17] = 0;
  if (dummy[0x19] != -1) {
    std::bitset<25UL>::set
              ((bitset<25UL> *)
               &message[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_false>
                .value.m_view.second,(long)dummy[0x19],true);
  }
  return dummy[0x19] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }